

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::infer_property_clocking(Generator *top)

{
  undefined1 local_58 [8];
  AssertPropertyVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  AssertPropertyVisitor::AssertPropertyVisitor((AssertPropertyVisitor *)local_58);
  IRVisitor::visit_root_s
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  AssertPropertyVisitor::~AssertPropertyVisitor((AssertPropertyVisitor *)local_58);
  return;
}

Assistant:

void infer_property_clocking(Generator* top) {
    AssertPropertyVisitor visitor;
    visitor.visit_root_s(top);
}